

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_hashmap.h
# Opt level: O0

void __thiscall
v_hashmap<unsigned_long,_features>::put_after_get_nogrow
          (v_hashmap<unsigned_long,_features> *this,unsigned_long *key,uint64_t hash,features *val)

{
  unsigned_long uVar1;
  hash_elem *phVar2;
  void *in_RCX;
  uint64_t in_RDX;
  unsigned_long *in_RSI;
  long in_RDI;
  
  phVar2 = v_array<v_hashmap<unsigned_long,_features>::hash_elem>::operator[]
                     ((v_array<v_hashmap<unsigned_long,_features>::hash_elem> *)(in_RDI + 0x78),
                      *(size_t *)(in_RDI + 0x98));
  phVar2->occupied = true;
  uVar1 = *in_RSI;
  phVar2 = v_array<v_hashmap<unsigned_long,_features>::hash_elem>::operator[]
                     ((v_array<v_hashmap<unsigned_long,_features>::hash_elem> *)(in_RDI + 0x78),
                      *(size_t *)(in_RDI + 0x98));
  phVar2->key = uVar1;
  phVar2 = v_array<v_hashmap<unsigned_long,_features>::hash_elem>::operator[]
                     ((v_array<v_hashmap<unsigned_long,_features>::hash_elem> *)(in_RDI + 0x78),
                      *(size_t *)(in_RDI + 0x98));
  memcpy(&phVar2->val,in_RCX,100);
  phVar2 = v_array<v_hashmap<unsigned_long,_features>::hash_elem>::operator[]
                     ((v_array<v_hashmap<unsigned_long,_features>::hash_elem> *)(in_RDI + 0x78),
                      *(size_t *)(in_RDI + 0x98));
  phVar2->hash = in_RDX;
  return;
}

Assistant:

void put_after_get_nogrow(const K& key, uint64_t hash, const V& val)
  {  // printf("++[lp=%d\tocc=%d\thash=%llu]\n", last_position, dat[last_position].occupied, hash);
    dat[last_position].occupied = true;
    dat[last_position].key = key;
    dat[last_position].val = val;
    dat[last_position].hash = hash;
  }